

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

size_t Curl_is_absolute_url(char *url,char *buf,size_t buflen,_Bool guess_scheme)

{
  char cVar1;
  size_t len;
  char *pcStack_38;
  char s;
  size_t i;
  _Bool guess_scheme_local;
  size_t buflen_local;
  char *buf_local;
  char *url_local;
  
  pcStack_38 = (char *)0x0;
  if (buf != (char *)0x0) {
    *buf = '\0';
  }
  if ((('`' < *url) && (*url < '{')) || (('@' < *url && (*url < '[')))) {
    for (pcStack_38 = (char *)0x1;
        ((pcStack_38 < (char *)0x28 && (cVar1 = url[(long)pcStack_38], cVar1 != '\0')) &&
        ((((('/' < cVar1 && (cVar1 < ':')) || (('`' < cVar1 && (cVar1 < '{')))) ||
          (('@' < cVar1 && (cVar1 < '[')))) ||
         (((cVar1 == '+' || (cVar1 == '-')) || (cVar1 == '.')))))); pcStack_38 = pcStack_38 + 1) {
    }
  }
  if (((pcStack_38 == (char *)0x0) || (url[(long)pcStack_38] != ':')) ||
     (((url + 1)[(long)pcStack_38] != '/' && (guess_scheme)))) {
    url_local = (char *)0x0;
  }
  else {
    if (buf != (char *)0x0) {
      Curl_strntolower(buf,url,(size_t)pcStack_38);
      buf[(long)pcStack_38] = '\0';
    }
    url_local = pcStack_38;
  }
  return (size_t)url_local;
}

Assistant:

size_t Curl_is_absolute_url(const char *url, char *buf, size_t buflen,
                            bool guess_scheme)
{
  size_t i = 0;
  DEBUGASSERT(!buf || (buflen > MAX_SCHEME_LEN));
  (void)buflen; /* only used in debug-builds */
  if(buf)
    buf[0] = 0; /* always leave a defined value in buf */
#ifdef _WIN32
  if(guess_scheme && STARTS_WITH_DRIVE_PREFIX(url))
    return 0;
#endif
  if(ISALPHA(url[0]))
    for(i = 1; i < MAX_SCHEME_LEN; ++i) {
      char s = url[i];
      if(s && (ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') )) {
        /* RFC 3986 3.1 explains:
           scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
        */
      }
      else {
        break;
      }
    }
  if(i && (url[i] == ':') && ((url[i + 1] == '/') || !guess_scheme)) {
    /* If this does not guess scheme, the scheme always ends with the colon so
       that this also detects data: URLs etc. In guessing mode, data: could
       be the hostname "data" with a specified port number. */

    /* the length of the scheme is the name part only */
    size_t len = i;
    if(buf) {
      Curl_strntolower(buf, url, i);
      buf[i] = 0;
    }
    return len;
  }
  return 0;
}